

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O3

int LiteScript::Syntax::ReadOperator
              (char *text,
              vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              *op,bool *need_value,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer pIVar3;
  pointer pIVar4;
  bool bVar5;
  Syntax SVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  pointer pOVar10;
  uint *errorType_00;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *pvVar11;
  uint i_3;
  uint i_2;
  int iVar12;
  uint uVar13;
  Operators OVar14;
  Syntax *this;
  uint i_1;
  Syntax SVar15;
  uint i;
  ulong uVar16;
  string name;
  string local_78;
  int local_54;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *local_50;
  bool *local_48;
  Instruction local_40;
  
  *need_value = true;
  bVar7 = *text;
  local_48 = need_value;
  if (0x5a < bVar7) {
    if (bVar7 != 0x5b) {
      if (bVar7 == 0x5e) {
        OVar14 = OP_BIT_XOR;
      }
      else {
        if (bVar7 != 0x7c) goto switchD_0013869f_caseD_22;
        if (text[1] == '|') {
          OVar14 = OP_OR;
          goto LAB_00138e02;
        }
        OVar14 = OP_BIT_OR;
      }
      goto LAB_00138e20;
    }
    pOVar10 = (op->
              super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pvVar11 = instrl;
    if (pOVar10 !=
        (op->
        super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (OP_Priority[pOVar10[-1]] != '\x01') break;
        PopOperator(op,instrl);
        pOVar10 = (op->
                  super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      } while (pOVar10 !=
               (op->
               super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
               )._M_impl.super__Vector_impl_data._M_start);
    }
    uVar16 = 0;
    while( true ) {
      while( true ) {
        uVar13 = (uint)uVar16;
        if ((0x20 < (ulong)(byte)text[uVar16 + 1]) ||
           ((0x100000600U >> ((ulong)(byte)text[uVar16 + 1] & 0x3f) & 1) == 0)) break;
        uVar16 = (ulong)(uVar13 + 1);
      }
      uVar8 = ReadComment(text + uVar16 + 1);
      if (uVar8 == 0) break;
      uVar16 = (ulong)(uVar13 + uVar8);
    }
    iVar12 = uVar13 + 1;
    iVar9 = ReadExpression((Syntax *)(text + (long)(int)uVar13 + 1),(char *)instrl,
                           (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                            *)errorType,(ErrorType *)pvVar11);
    if (iVar9 < 1) {
      if (iVar9 != 0) goto LAB_00138f45;
      goto LAB_00138de0;
    }
    iVar9 = iVar9 + iVar12;
    uVar13 = 0;
    while( true ) {
      while( true ) {
        if ((0x20 < (ulong)(byte)text[(ulong)uVar13 + (long)iVar9]) ||
           ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar13 + (long)iVar9] & 0x3f) & 1) == 0))
        break;
        uVar13 = uVar13 + 1;
      }
      uVar8 = ReadComment(text + (ulong)uVar13 + (long)iVar9);
      if (uVar8 == 0) break;
      uVar13 = uVar13 + uVar8;
    }
    iVar12 = uVar13 + iVar9;
    if (text[iVar12] != ']') {
      *errorType = SCRPT_ERROR_BRACKET_CLOSE;
      goto LAB_00138ebf;
    }
    Instruction::Instruction((Instruction *)&local_78,INSTR_OP_ARRAY);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_78);
    goto LAB_00138f1c;
  }
  errorType_00 = &switchD_0013869f::switchdataD_00142acc;
  switch(bVar7) {
  case 0x21:
    if (text[1] != '=') {
      *errorType = SCRPT_ERROR_OPERATOR;
      return 0xffffffff;
    }
    OVar14 = OP_DIF;
    break;
  default:
switchD_0013869f_caseD_22:
    *need_value = false;
    return 0;
  case 0x25:
    OVar14 = OP_MOD;
LAB_00138e20:
    PushOperator(op,OVar14,instrl);
    return 1;
  case 0x26:
    if (text[1] != '&') {
      OVar14 = OP_BIT_AND;
      goto LAB_00138e20;
    }
    OVar14 = OP_AND;
    break;
  case 0x28:
    pOVar10 = (op->
              super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pOVar10 !=
        (op->
        super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (OP_Priority[pOVar10[-1]] != '\x01') break;
        PopOperator(op,instrl);
        pOVar10 = (op->
                  super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      } while (pOVar10 !=
               (op->
               super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
               )._M_impl.super__Vector_impl_data._M_start);
    }
    Instruction::Instruction((Instruction *)&local_78,INSTR_PUSH_ARGS);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_78);
    Instruction::~Instruction((Instruction *)&local_78);
    SVar15 = *(Syntax *)(text + 1);
    iVar12 = 1;
    if (SVar15 != (Syntax)0x29) {
      this = (Syntax *)(text + 1);
      local_54 = 0;
      bVar5 = true;
      local_50 = instrl;
LAB_00138907:
      uVar13 = 0;
      SVar6 = SVar15;
      do {
        if (((byte)SVar6 < 0x21) && ((0x100000600U >> ((ulong)(byte)SVar6 & 0x3f) & 1) != 0)) {
          uVar13 = uVar13 + 1;
        }
        else {
          uVar8 = ReadComment((char *)(this + uVar13));
          pvVar11 = local_50;
          if (uVar8 == 0) goto LAB_00138937;
          uVar13 = uVar13 + uVar8;
        }
        SVar6 = this[uVar13];
      } while( true );
    }
    goto LAB_00138ec8;
  case 0x2a:
    if (text[1] != '=') {
      OVar14 = OP_MUL;
      goto LAB_00138e20;
    }
    OVar14 = OP_MUL_ASSIGN;
    break;
  case 0x2b:
    if (text[1] != '=') {
      OVar14 = OP_ADD;
      goto LAB_00138e20;
    }
    OVar14 = OP_ADD_ASSIGN;
    break;
  case 0x2d:
    if (text[1] != '=') {
      OVar14 = OP_SUB;
      goto LAB_00138e20;
    }
    OVar14 = OP_SUB_ASSIGN;
    break;
  case 0x2e:
    pOVar10 = (op->
              super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pOVar10 !=
        (op->
        super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (OP_Priority[pOVar10[-1]] != '\x01') break;
        PopOperator(op,instrl);
        pOVar10 = (op->
                  super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      } while (pOVar10 !=
               (op->
               super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
               )._M_impl.super__Vector_impl_data._M_start);
    }
    uVar13 = 0;
    while( true ) {
      while( true ) {
        if ((0x20 < (ulong)(byte)text[(ulong)uVar13 + 1]) ||
           ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar13 + 1] & 0x3f) & 1) == 0)) break;
        uVar13 = uVar13 + 1;
      }
      uVar8 = ReadComment(text + (ulong)uVar13 + 1);
      if (uVar8 == 0) break;
      uVar13 = uVar13 + uVar8;
    }
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    uVar8 = ReadName(text + (long)(int)uVar13 + 1,&local_78);
    if (uVar8 == 0) {
      *errorType = SCRPT_ERROR_NAME;
      uVar8 = ~uVar13;
    }
    else {
      Instruction::Instruction(&local_40,INSTR_OP_MEMBER,local_78._M_dataplus._M_p);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(instrl,&local_40);
      uVar8 = uVar13 + 1 + uVar8;
      Instruction::~Instruction(&local_40);
      *local_48 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      return uVar8;
    }
    operator_delete(local_78._M_dataplus._M_p);
    return uVar8;
  case 0x2f:
    if (text[1] != '=') {
      OVar14 = OP_DIV;
      goto LAB_00138e20;
    }
    OVar14 = OP_DIV_ASSIGN;
    break;
  case 0x3c:
    if (text[1] == '<') {
      OVar14 = OP_LSHIFT;
    }
    else {
      if (text[1] != '=') {
        OVar14 = OP_LESS;
        goto LAB_00138e20;
      }
      OVar14 = OP_LESS_EQU;
    }
    break;
  case 0x3d:
    if (text[1] != '=') {
      OVar14 = OP_ASSIGN;
      goto LAB_00138e20;
    }
    OVar14 = OP_EQU;
    break;
  case 0x3e:
    if (text[1] == '>') {
      OVar14 = OP_RSHIFT;
    }
    else {
      if (text[1] != '=') {
        OVar14 = OP_GREAT;
        goto LAB_00138e20;
      }
      OVar14 = OP_GREAT_EQU;
    }
    break;
  case 0x3f:
    pOVar10 = (op->
              super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pOVar10 !=
        (op->
        super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (OP_Priority[pOVar10[-1]] != OP_Priority[0x1e]) break;
        PopOperator(op,instrl);
        pOVar10 = (op->
                  super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      } while (pOVar10 !=
               (op->
               super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
               )._M_impl.super__Vector_impl_data._M_start);
    }
    pIVar1 = (instrl->
             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pIVar2 = (instrl->
             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar16 = 0;
    local_50 = instrl;
    while( true ) {
      while( true ) {
        uVar13 = (uint)uVar16;
        if ((0x20 < (ulong)(byte)text[uVar16 + 1]) ||
           ((0x100000600U >> ((ulong)(byte)text[uVar16 + 1] & 0x3f) & 1) == 0)) break;
        uVar16 = (ulong)(uVar13 + 1);
      }
      uVar8 = ReadComment(text + uVar16 + 1);
      if (uVar8 == 0) break;
      uVar16 = (ulong)(uVar13 + uVar8);
    }
    Instruction::Instruction((Instruction *)&local_78,INSTR_JUMP_ELSE);
    pvVar11 = local_50;
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(local_50,(Instruction *)&local_78);
    iVar9 = uVar13 + 1;
    Instruction::~Instruction((Instruction *)&local_78);
    iVar12 = ReadExpression((Syntax *)(text + iVar9),(char *)pvVar11,
                            (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                             *)errorType,errorType_00);
    if (0 < iVar12) {
      iVar12 = iVar12 + iVar9;
      uVar13 = 0;
      while( true ) {
        while( true ) {
          if ((0x20 < (ulong)(byte)text[(ulong)uVar13 + (long)iVar12]) ||
             ((0x100000600U >> ((ulong)(byte)text[(ulong)uVar13 + (long)iVar12] & 0x3f) & 1) == 0))
          break;
          uVar13 = uVar13 + 1;
        }
        uVar8 = ReadComment(text + (ulong)uVar13 + (long)iVar12);
        pvVar11 = local_50;
        if (uVar8 == 0) break;
        uVar13 = uVar13 + uVar8;
      }
      pIVar3 = (local_50->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pIVar4 = (local_50->
               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
               )._M_impl.super__Vector_impl_data._M_start;
      Instruction::Instruction((Instruction *)&local_78,INSTR_JUMP_TO);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(pvVar11,(Instruction *)&local_78);
      Instruction::~Instruction((Instruction *)&local_78);
      Instruction::Instruction
                ((Instruction *)&local_78,INSTR_JUMP_ELSE,
                 (int)((ulong)((long)(pvVar11->
                                     super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar11->
                                    super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 4));
      Instruction::operator=
                ((Instruction *)
                 (&((pvVar11->
                    super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                    )._M_impl.super__Vector_impl_data._M_start)->code +
                 (((long)pIVar2 - (long)pIVar1) * 0x10000000 >> 0x1c)),(Instruction *)&local_78);
      iVar12 = uVar13 + iVar12;
      Instruction::~Instruction((Instruction *)&local_78);
      pvVar11 = local_50;
      if (text[iVar12] != ':') {
        *errorType = SCRPT_ERROR_COLON;
        return -iVar12;
      }
      uVar13 = 0;
      bVar7 = 0x3a;
      do {
        if ((bVar7 < 0x21) && ((0x100000600U >> ((ulong)bVar7 & 0x3f) & 1) != 0)) {
          uVar13 = uVar13 + 1;
        }
        else {
          uVar8 = ReadComment(text + (ulong)uVar13 + (long)iVar12);
          if (uVar8 == 0) goto LAB_00138e48;
          uVar13 = uVar13 + uVar8;
        }
        bVar7 = text[(ulong)uVar13 + (long)iVar12];
      } while( true );
    }
    if (iVar12 != 0) {
      return iVar12 - iVar9;
    }
LAB_00138de0:
    *errorType = SCRPT_ERROR_EXPRESSION;
    return ~uVar13;
  }
LAB_00138e02:
  PushOperator(op,OVar14,instrl);
  return 2;
LAB_00138937:
  if (uVar13 == 0) {
    if (bVar5) {
      uVar13 = ReadExpression(this,(char *)local_50,
                              (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                               *)errorType,errorType_00);
      iVar9 = local_54;
      if ((int)uVar13 < 1) {
        if ((int)uVar13 < 0) {
          return uVar13 - iVar12;
        }
LAB_00138f4b:
        *errorType = SCRPT_ERROR_PARENTHESIS_CLOSE;
        return -iVar12;
      }
      Instruction::Instruction((Instruction *)&local_78,INSTR_DEFINE_ARG,local_54);
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(pvVar11,(Instruction *)&local_78);
      local_54 = iVar9 + 1;
      Instruction::~Instruction((Instruction *)&local_78);
      bVar5 = false;
    }
    else {
      if (SVar15 != (Syntax)0x2c) goto LAB_00138f4b;
      uVar13 = 1;
      bVar5 = true;
    }
  }
  iVar12 = uVar13 + iVar12;
  this = (Syntax *)(text + iVar12);
  SVar15 = *(Syntax *)(text + iVar12);
  errorType_00 = (uint *)text;
  if (SVar15 == (Syntax)0x29) goto code_r0x001389d3;
  goto LAB_00138907;
LAB_00138e48:
  iVar12 = uVar13 + iVar12;
  iVar9 = ReadExpression((Syntax *)(text + iVar12),(char *)pvVar11,
                         (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                          *)errorType,errorType_00);
  if (0 < iVar9) {
    Instruction::Instruction
              ((Instruction *)&local_78,INSTR_JUMP_TO,
               (int)((ulong)((long)(pvVar11->
                                   super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar11->
                                  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 4));
    Instruction::operator=
              ((Instruction *)
               (&((pvVar11->
                  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                  )._M_impl.super__Vector_impl_data._M_start)->code +
               (((long)pIVar3 - (long)pIVar4) * 0x10000000 >> 0x1c)),(Instruction *)&local_78);
    Instruction::~Instruction((Instruction *)&local_78);
    return iVar9 + iVar12;
  }
  if (iVar9 != 0) {
LAB_00138f45:
    return iVar9 - iVar12;
  }
  *errorType = SCRPT_ERROR_EXPRESSION;
LAB_00138ebf:
  return -iVar12;
code_r0x001389d3:
  instrl = local_50;
  if ((bool)(bVar5 & 0 < local_54)) {
    *errorType = SCRPT_ERROR_EXPRESSION;
    goto LAB_00138ebf;
  }
LAB_00138ec8:
  pOVar10 = (op->
            super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((pOVar10 ==
       (op->
       super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
       )._M_impl.super__Vector_impl_data._M_start) || (pOVar10[-1] != OP_NEW)) {
    Instruction::Instruction((Instruction *)&local_78,INSTR_OP_CALL);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_78);
  }
  else {
    (op->
    super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
    )._M_impl.super__Vector_impl_data._M_finish = pOVar10 + -1;
    Instruction::Instruction((Instruction *)&local_78,INSTR_VALUE_OBJECT);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,(Instruction *)&local_78);
  }
LAB_00138f1c:
  Instruction::~Instruction((Instruction *)&local_78);
  *local_48 = false;
  return iVar12 + 1;
}

Assistant:

int LiteScript::Syntax::ReadOperator(const char *text, std::vector<Operators> &op, bool& need_value, std::vector<Instruction> &instrl,
                                     Script::ErrorType &errorType) {
    need_value = true;
    if (text[0] == '(') {
        while (op.size() > 0 && OP_Priority[op.back()] == 1)
            PopOperator(op, instrl);
        instrl.push_back(Instruction(InstrCode::INSTR_PUSH_ARGS));
        int i = 1, index = 0;
        union {
            int i;
            unsigned int ui;
        } tmp;
        bool need_arg = true;
        while (text[i] != ')') {
            if ((tmp.ui = ReadWhitespace(text + i)) > 0)
                i += (int)tmp.ui;
            else if (need_arg && (tmp.i = ReadExpression(text + i, instrl, errorType)) > 0) {
                i += tmp.i;
                need_arg = false;
                instrl.push_back(Instruction(InstrCode::INSTR_DEFINE_ARG, index++));
            }
            else if (tmp.i < 0)
                return tmp.i - i;
            else if (!need_arg && text[i] == ',') {
                i++;
                need_arg = true;
            }
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_PARENTHESIS_CLOSE;
                return -i;
            }
        }
        if (need_arg && index > 0) {
            errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
            return -i;
        }
        if (op.size() > 0 && op.back() == Operators::OP_NEW) {
            op.pop_back();
            instrl.push_back(Instruction(InstrCode::INSTR_VALUE_OBJECT));
        }
        else
            instrl.push_back(Instruction(InstrCode::INSTR_OP_CALL));
        need_value = false;
        return i + 1;
    }
    else if (text[0] == '[') {
        while (op.size() > 0 && OP_Priority[op.back()] == 1)
            PopOperator(op, instrl);
        int i = 1, tmp;
        i += (int)ReadWhitespace(text + i);
        if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                return -i;
            }
        }
        i += tmp;
        i += (int)ReadWhitespace(text + i);
        if (text[i] != ']') {
            errorType = Script::ErrorType::SCRPT_ERROR_BRACKET_CLOSE;
            return -i;
        }
        instrl.push_back(Instruction(InstrCode::INSTR_OP_ARRAY));
        need_value = false;
        return i + 1;
    }
    else if (text[0] == '.') {
        while (op.size() > 0 && OP_Priority[op.back()] == 1)
            PopOperator(op, instrl);
        int i = 1;
        i += (int)ReadWhitespace(text + i);
        unsigned int tmp;
        std::string name;
        if ((tmp = ReadName(text + i, name)) == 0) {
            errorType = Script::ErrorType::SCRPT_ERROR_NAME;
            return -i;
        }
        i += (int)tmp;
        instrl.push_back(Instruction(InstrCode::INSTR_OP_MEMBER, name.c_str()));
        need_value = false;
        return i;
    }
    else if (text[0] == '?') {
        while (op.size() > 0 && OP_Priority[op.back()] == OP_Priority[Operators::OP_ASSIGN])
            PopOperator(op, instrl);
        int i = 1, tmp, line_je = instrl.size();
        i += (int)ReadWhitespace(text + i);
        instrl.push_back(Instruction(InstrCode::INSTR_JUMP_ELSE));
        if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                return -i;
            }
        }
        i += tmp;
        i += (int)ReadWhitespace(text + i);
        int line_jt = instrl.size();
        instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO));
        instrl[line_je] = Instruction(InstrCode::INSTR_JUMP_ELSE, (int)instrl.size());
        if (text[i] != ':') {
            errorType = Script::ErrorType::SCRPT_ERROR_COLON;
            return -i;
        }
        i += (int)ReadWhitespace(text + i);
        if ((tmp = ReadExpression(text + i, instrl, errorType)) <= 0) {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_EXPRESSION;
                return -i;
            }
        }
        instrl[line_jt] = Instruction(InstrCode::INSTR_JUMP_TO, (int)instrl.size());
        i += tmp;
        return i;
    }
    else {
        switch (text[0]) {
            case '+':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_ADD_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_ADD, instrl);
                    return 1;
                }
            case '-':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_SUB_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_SUB, instrl);
                    return 1;
                }
            case '*':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_MUL_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_MUL, instrl);
                    return 1;
                }
            case '/':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_DIV_ASSIGN, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_DIV, instrl);
                    return 1;
                }
            case '%':
                PushOperator(op, Operators::OP_MOD, instrl);
                return 1;
            case '=':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_EQU, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_ASSIGN, instrl);
                    return 1;
                }
            case '!':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_DIF, instrl);
                    return 2;
                }
                else {
                    errorType = Script::ErrorType::SCRPT_ERROR_OPERATOR;
                    return -1;
                }
            case '<':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_LESS_EQU, instrl);
                    return 2;
                }
                else if (text[1] == '<') {
                    PushOperator(op, Operators::OP_LSHIFT, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_LESS, instrl);
                    return 1;
                }
            case '>':
                if (text[1] == '=') {
                    PushOperator(op, Operators::OP_GREAT_EQU, instrl);
                    return 2;
                }
                else if (text[1] == '>') {
                    PushOperator(op, Operators::OP_RSHIFT, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_GREAT, instrl);
                    return 1;
                }
            case '&':
                if (text[1] == '&') {
                    PushOperator(op, Operators::OP_AND, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_BIT_AND, instrl);
                    return 1;
                }
            case '|':
                if (text[1] == '|') {
                    PushOperator(op, Operators::OP_OR, instrl);
                    return 2;
                }
                else {
                    PushOperator(op, Operators::OP_BIT_OR, instrl);
                    return 1;
                }
            case '^':
                PushOperator(op, Operators::OP_BIT_XOR, instrl);
                return 1;
            default:
                need_value = false;
                return 0;
        }
    }
}